

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O2

void vocdusave_newobj(voccxdef *ctx,objnum objn)

{
  ushort *puVar1;
  objucxdef *undoctx;
  uchar *puVar2;
  uint16_t tmp;
  
  undoctx = ctx->voccxundo;
  puVar2 = objures(undoctx,'\x05',3);
  *puVar2 = '\x02';
  *(objnum *)(puVar2 + 1) = objn;
  puVar1 = &undoctx->objucxhead;
  *puVar1 = *puVar1 + 3;
  return;
}

Assistant:

void vocdusave_newobj(voccxdef *ctx, objnum objn)
{
    objucxdef *uc = ctx->voccxundo;
    uchar     *p;

    p = objures(uc, OBJUCLI, 3);
    *p = VOC_UNDO_NEWOBJ;
    oswp2(p+1, objn);

    uc->objucxhead += 3;
}